

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

sexp_conflict sexp_gc(sexp_conflict ctx,size_t *sum_freed)

{
  sexp_uint_t *psVar1;
  sexp_conflict psVar2;
  rusage end;
  rusage start;
  rusage local_140;
  rusage local_b0;
  
  getrusage(RUSAGE_SELF,&local_b0);
  sexp_mark(ctx,ctx);
  sexp_reset_weak_references(ctx);
  sexp_finalize(ctx);
  psVar2 = sexp_sweep(ctx,sum_freed);
  psVar1 = &(ctx->value).context.gc_count;
  *psVar1 = *psVar1 + 1;
  getrusage(RUSAGE_SELF,&local_140);
  psVar1 = &(ctx->value).context.gc_usecs;
  *psVar1 = *psVar1 + (((local_140.ru_utime.tv_sec - local_b0.ru_utime.tv_sec) * 1000000 +
                       local_140.ru_utime.tv_usec) - local_b0.ru_utime.tv_usec);
  return psVar2;
}

Assistant:

sexp sexp_gc (sexp ctx, size_t *sum_freed) {
  sexp res, finalized SEXP_NO_WARN_UNUSED;
#if SEXP_USE_TIME_GC
  sexp_uint_t gc_usecs;
  struct rusage start, end;
  getrusage(RUSAGE_SELF, &start);
  sexp_debug_printf("%p (heap: %p size: %lu)", ctx, sexp_context_heap(ctx),
                    sexp_heap_total_size(sexp_context_heap(ctx)));
#endif
  sexp_mark_global_symbols(ctx);
  sexp_mark(ctx, ctx);
  sexp_conservative_mark(ctx);
  sexp_reset_weak_references(ctx);
  finalized = sexp_finalize(ctx);
  res = sexp_sweep(ctx, sum_freed);
  ++sexp_context_gc_count(ctx);
#if SEXP_USE_TIME_GC
  getrusage(RUSAGE_SELF, &end);
  gc_usecs = (end.ru_utime.tv_sec - start.ru_utime.tv_sec) * 1000000 +
    end.ru_utime.tv_usec - start.ru_utime.tv_usec;
  sexp_context_gc_usecs(ctx) += gc_usecs;
  sexp_debug_printf("%p (freed: %lu max_freed: %lu finalized: %lu time: %luus)",
                    ctx, (sum_freed ? *sum_freed : 0), sexp_unbox_fixnum(res),
                    sexp_unbox_fixnum(finalized), gc_usecs);
#endif
  return res;
}